

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O2

Array * __thiscall
QPDFObjectHandle::as_array(Array *__return_storage_ptr__,QPDFObjectHandle *this,typed options)

{
  qpdf_object_type_e qVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((options & error) != strict) {
    assertType(this,"array",false);
  }
  if ((((options & any_flag) == strict) &&
      (qVar1 = ::qpdf::BaseHandle::type_code(&this->super_BaseHandle), qVar1 != ot_array)) &&
     (((options & optional) == strict ||
      (qVar1 = ::qpdf::BaseHandle::type_code(&this->super_BaseHandle), qVar1 != ot_null)))) {
    (__return_storage_ptr__->super_BaseHandle).obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->super_BaseHandle).obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->sp_elements)._M_t.
    super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    .
    super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
    ._M_head_impl = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    return __return_storage_ptr__;
  }
  ::qpdf::Array::Array(__return_storage_ptr__,(shared_ptr<QPDFObject> *)this);
  return __return_storage_ptr__;
}

Assistant:

inline qpdf::Array
QPDFObjectHandle::as_array(qpdf::typed options) const
{
    if (options & qpdf::error) {
        assertType("array", false);
    }
    if (options & qpdf::any_flag || type_code() == ::ot_array ||
        (options & qpdf::optional && type_code() == ::ot_null)) {
        return qpdf::Array(obj);
    }
    return qpdf::Array(std::shared_ptr<QPDFObject>());
}